

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdatastream.h
# Opt level: O1

QDataStream *
QtPrivate::readArrayBasedContainer<QList<QHeaderViewPrivate::SectionItem>>
          (QDataStream *s,QList<QHeaderViewPrivate::SectionItem> *c)

{
  QDataStream QVar1;
  QDataStream QVar2;
  char cVar3;
  SectionItem asize;
  long in_FS_OFFSET;
  qint64 extendedLen;
  quint32 first;
  SectionItem local_48;
  uint local_3c;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  QVar1 = s[0x13];
  cVar3 = QDataStream::isDeviceTransactionStarted();
  if (cVar3 == '\0') {
    QDataStream::resetStatus();
  }
  QList<QHeaderViewPrivate::SectionItem>::clear(c);
  local_3c = 0xaaaaaaaa;
  QDataStream::operator>>(s,(int *)&local_3c);
  asize.field_4.calculated_startpos = 0;
  asize._0_4_ = local_3c;
  if (asize == (SectionItem)0xffffffff) {
    asize = (SectionItem)0xffffffffffffffff;
  }
  else if ((local_3c == 0xfffffffe) && (0x15 < *(int *)(s + 0x18))) {
    local_48 = (SectionItem)&DAT_aaaaaaaaaaaaaaaa;
    QDataStream::operator>>(s,(longlong *)&local_48);
    asize = local_48;
  }
  if ((long)asize < 0) {
    QDataStream::setStatus((Status)s);
  }
  else {
    QList<QHeaderViewPrivate::SectionItem>::reserve(c,(qsizetype)asize);
    if (asize != (SectionItem)0x0) {
      do {
        asize = (SectionItem)((long)asize + -1);
        local_48 = (SectionItem)0xaaaaaaaaa8000000;
        ::operator>>(s,&local_48);
        QVar2 = s[0x13];
        if (QVar2 == (QDataStream)0x0) {
          QPodArrayOps<QHeaderViewPrivate::SectionItem>::
          emplace<QHeaderViewPrivate::SectionItem_const&>
                    ((QPodArrayOps<QHeaderViewPrivate::SectionItem> *)c,(c->d).size,&local_48);
          QList<QHeaderViewPrivate::SectionItem>::end(c);
        }
        else {
          QList<QHeaderViewPrivate::SectionItem>::clear(c);
        }
      } while ((QVar2 == (QDataStream)0x0) && (asize != (SectionItem)0x0));
    }
  }
  if (QVar1 != (QDataStream)0x0) {
    QDataStream::resetStatus();
    QDataStream::setStatus((Status)s);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return s;
}

Assistant:

QDataStream &readArrayBasedContainer(QDataStream &s, Container &c)
{
    StreamStateSaver stateSaver(&s);

    c.clear();
    qint64 size = QDataStream::readQSizeType(s);
    qsizetype n = size;
    if (size != n || size < 0) {
        s.setStatus(QDataStream::SizeLimitExceeded);
        return s;
    }
    c.reserve(n);
    for (qsizetype i = 0; i < n; ++i) {
        typename Container::value_type t;
        s >> t;
        if (s.status() != QDataStream::Ok) {
            c.clear();
            break;
        }
        c.append(t);
    }

    return s;
}